

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

int64_t msa_srar_df(uint32_t df,int64_t arg1,int64_t arg2)

{
  ulong uVar1;
  
  uVar1 = ~(-1L << ((char)df + 3U & 0x3f)) & arg2;
  if (uVar1 != 0) {
    arg1 = (arg1 >> ((byte)uVar1 & 0x3f)) +
           (ulong)(((ulong)arg1 >> ((ulong)((int)uVar1 - 1) & 0x3f) & 1) != 0);
  }
  return arg1;
}

Assistant:

static inline int64_t msa_srar_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    int32_t b_arg2 = BIT_POSITION(arg2, df);
    if (b_arg2 == 0) {
        return arg1;
    } else {
        int64_t r_bit = (arg1 >> (b_arg2 - 1)) & 1;
        return (arg1 >> b_arg2) + r_bit;
    }
}